

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_provider.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PixieProvider::CheckType
          (PixieProvider *this,ByteBuffer *message_frame,uchar *expected_type)

{
  uint uVar1;
  ostream *poVar2;
  invalid_argument *this_00;
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream error_message;
  ostream local_1a0 [383];
  uchar local_21;
  byte *pbStack_20;
  uchar received_type;
  uchar *expected_type_local;
  ByteBuffer *message_frame_local;
  PixieProvider *this_local;
  
  pbStack_20 = expected_type;
  expected_type_local = (uchar *)message_frame;
  message_frame_local = (ByteBuffer *)this;
  uVar1 = (**(message_frame->super_InputStream)._vptr_InputStream)();
  local_21 = (uchar)uVar1;
  if ((uVar1 & 0xff) != (uint)*pbStack_20) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar2 = std::operator<<(local_1a0,"received a message fo type ");
    poVar2 = std::operator<<(poVar2,local_21);
    poVar2 = std::operator<<(poVar2," when expecting a message of type ");
    std::operator<<(poVar2,*pbStack_20);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::invalid_argument::invalid_argument(this_00,local_1e0);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

void PixieProvider::CheckType(ByteBuffer& message_frame, const unsigned char& expected_type)
{
    unsigned char received_type = message_frame.ReadByte();

    if (received_type != expected_type)
    {
        std::stringstream error_message;
        error_message << "received a message fo type " << received_type << " when expecting a message of type " << expected_type;
        throw std::invalid_argument(error_message.str());
    }
}